

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int frame_pack_headers_shared(nghttp2_bufs *bufs,nghttp2_frame_hd *frame_hd)

{
  nghttp2_buf_chain *pnVar1;
  size_t sVar2;
  undefined1 local_40 [8];
  nghttp2_frame_hd hd;
  nghttp2_buf_chain *ce;
  nghttp2_buf_chain *ci;
  nghttp2_buf *buf;
  nghttp2_frame_hd *frame_hd_local;
  nghttp2_bufs *bufs_local;
  
  pnVar1 = bufs->head;
  hd.length._0_4_ = frame_hd->stream_id;
  hd.length._4_1_ = frame_hd->type;
  hd.length._5_1_ = frame_hd->flags;
  hd.length._6_1_ = frame_hd->reserved;
  hd.length._7_1_ = frame_hd->field_0xf;
  local_40 = (undefined1  [8])((long)(pnVar1->buf).last - (long)(pnVar1->buf).pos);
  if (bufs->head != bufs->cur) {
    hd.length = hd.length & 0xfffffbffffffffff;
  }
  (pnVar1->buf).pos = (pnVar1->buf).pos + -9;
  nghttp2_frame_pack_frame_hd((pnVar1->buf).pos,(nghttp2_frame_hd *)local_40);
  sVar2 = hd.length;
  if (bufs->head != bufs->cur) {
    hd.length._0_5_ = CONCAT14(9,(undefined4)hd.length);
    hd.length._6_2_ = SUB82(sVar2,6);
    hd.length._0_6_ = CONCAT15(0,(uint5)hd.length);
    hd._8_8_ = bufs->cur;
    for (ce = bufs->head->next; ce != (nghttp2_buf_chain *)hd._8_8_; ce = ce->next) {
      local_40 = (undefined1  [8])((long)(ce->buf).last - (long)(ce->buf).pos);
      (ce->buf).pos = (ce->buf).pos + -9;
      nghttp2_frame_pack_frame_hd((ce->buf).pos,(nghttp2_frame_hd *)local_40);
    }
    local_40 = (undefined1  [8])((long)(ce->buf).last - (long)(ce->buf).pos);
    hd.length._0_6_ = CONCAT15(4,(uint5)hd.length);
    (ce->buf).pos = (ce->buf).pos + -9;
    nghttp2_frame_pack_frame_hd((ce->buf).pos,(nghttp2_frame_hd *)local_40);
  }
  return 0;
}

Assistant:

static int frame_pack_headers_shared(nghttp2_bufs *bufs,
                                     nghttp2_frame_hd *frame_hd) {
  nghttp2_buf *buf;
  nghttp2_buf_chain *ci, *ce;
  nghttp2_frame_hd hd;

  buf = &bufs->head->buf;

  hd = *frame_hd;
  hd.length = nghttp2_buf_len(buf);

  DEBUGF("send: HEADERS/PUSH_PROMISE, payloadlen=%zu\n", hd.length);

  /* We have multiple frame buffers, which means one or more
     CONTINUATION frame is involved. Remove END_HEADERS flag from the
     first frame. */
  if (bufs->head != bufs->cur) {
    hd.flags = (uint8_t)(hd.flags & ~NGHTTP2_FLAG_END_HEADERS);
  }

  buf->pos -= NGHTTP2_FRAME_HDLEN;
  nghttp2_frame_pack_frame_hd(buf->pos, &hd);

  if (bufs->head != bufs->cur) {
    /* 2nd and later frames are CONTINUATION frames. */
    hd.type = NGHTTP2_CONTINUATION;
    /* We don't have no flags except for last CONTINUATION */
    hd.flags = NGHTTP2_FLAG_NONE;

    ce = bufs->cur;

    for (ci = bufs->head->next; ci != ce; ci = ci->next) {
      buf = &ci->buf;

      hd.length = nghttp2_buf_len(buf);

      DEBUGF("send: int CONTINUATION, payloadlen=%zu\n", hd.length);

      buf->pos -= NGHTTP2_FRAME_HDLEN;
      nghttp2_frame_pack_frame_hd(buf->pos, &hd);
    }

    buf = &ci->buf;
    hd.length = nghttp2_buf_len(buf);
    /* Set END_HEADERS flag for last CONTINUATION */
    hd.flags = NGHTTP2_FLAG_END_HEADERS;

    DEBUGF("send: last CONTINUATION, payloadlen=%zu\n", hd.length);

    buf->pos -= NGHTTP2_FRAME_HDLEN;
    nghttp2_frame_pack_frame_hd(buf->pos, &hd);
  }

  return 0;
}